

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

_Bool fs_is_macos(void)

{
  return false;
}

Assistant:

bool fs_is_macos(){
// we don't use TargetConditionals.h because on macOS SDK updates sometimes including this header
// breaks compile until Homebrew / GCC updates.
#if defined(__APPLE__) && defined(__MACH__)
  return true;
#else
  return false;
#endif
}